

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

uint prvTidygetNextStringKey(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator local_38;
  TidyIterator local_20;
  size_t itemIndex;
  uint item;
  TidyIterator *iter_local;
  
  itemIndex._4_4_ = 0;
  if (iter != (TidyIterator *)0x0) {
    local_20 = *iter;
    if (local_20 != (TidyIterator)0x0) {
      uVar1 = tidyStringKeyListSize();
      if (local_20 <= (TidyIterator)(ulong)uVar1) {
        itemIndex._4_4_ = language_en.messages[(long)((long)&local_20[-1]._opaque + 3)].key;
        local_20 = (TidyIterator)((long)&local_20->_opaque + 1);
      }
    }
    uVar1 = tidyStringKeyListSize();
    if ((TidyIterator)(ulong)uVar1 < local_20) {
      local_38 = (TidyIterator)0x0;
    }
    else {
      local_38 = local_20;
    }
    *iter = local_38;
    return itemIndex._4_4_;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]libtidy/src/language.c"
                ,0x20e,"uint prvTidygetNextStringKey(TidyIterator *)");
}

Assistant:

uint TY_(getNextStringKey)( TidyIterator* iter )
{
    uint item = 0;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyStringKeyListSize() )
    {
        item = language_en.messages[ itemIndex - 1 ].key;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyStringKeyListSize() ? itemIndex : (size_t)0 );
    return item;
}